

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O1

Result_t * __thiscall
Kumu::ByteString::Append
          (Result_t *__return_storage_ptr__,ByteString *this,byte_t *buf,ui32_t buf_len)

{
  Result_t RStack_88;
  
  Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_OK);
  if (this->m_Capacity - this->m_Length < buf_len) {
    Capacity(&RStack_88,this,this->m_Capacity + buf_len);
    Result_t::operator=(__return_storage_ptr__,&RStack_88);
    Result_t::~Result_t(&RStack_88);
  }
  if (-1 < __return_storage_ptr__->value) {
    memcpy(this->m_Data + this->m_Length,buf,(ulong)buf_len);
    this->m_Length = this->m_Length + buf_len;
  }
  return __return_storage_ptr__;
}

Assistant:

Kumu::Result_t
Kumu::ByteString::Append(const byte_t* buf, ui32_t buf_len)
{
  Result_t result = RESULT_OK;
  ui32_t diff = m_Capacity - m_Length;

  if ( diff < buf_len )
    result = Capacity(m_Capacity + buf_len);

  if ( KM_SUCCESS(result) )
    {
      memcpy(m_Data + m_Length, buf, buf_len);
      m_Length += buf_len;
    }

  return result;
}